

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall
QPDF::checkHPageOffset
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *shared_idx_to_obj)

{
  uint *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_color _Var3;
  _Rb_tree_color _Var4;
  QPDFObjectHandle *this_00;
  pointer pQVar5;
  long lVar6;
  bool bVar7;
  undefined1 *puVar8;
  uint uVar9;
  uint uVar10;
  const_iterator cVar11;
  qpdf_offset_t qVar12;
  long *plVar13;
  undefined8 *puVar14;
  mapped_type *__v;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr *pp_Var17;
  ulong *puVar18;
  ulong uVar19;
  undefined8 *puVar20;
  size_type *psVar21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  undefined1 *puVar24;
  ulong uVar25;
  _Base_ptr p_Var26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  QPDFObjGen QVar30;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var31;
  QPDF *this_01;
  int iVar32;
  undefined8 uVar33;
  _Base_ptr p_Var34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  uint uVar37;
  int *piVar38;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  int obj;
  int idx;
  string __str_2;
  string __str_1;
  string __str;
  set<int,_std::less<int>,_std::allocator<int>_> hint_shared;
  set<int,_std::less<int>,_std::allocator<int>_> computed_shared;
  string __str_6;
  string __str_5;
  string __str_4;
  QPDFObjGen page_og;
  string __str_3;
  QPDFObjGen first_page_og;
  string local_228;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  undefined8 uStack_1f0;
  _Base_ptr *local_1e8;
  long local_1e0;
  _Base_ptr local_1d8;
  long lStack_1d0;
  _Base_ptr *local_1c8;
  long local_1c0;
  _Base_ptr local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  long *local_188;
  undefined8 local_180;
  long local_178;
  undefined8 uStack_170;
  QPDF *local_168;
  undefined1 local_160 [32];
  _Rb_tree_node_base *local_140;
  size_t local_138;
  ulong local_130;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_128;
  ulong local_f8;
  ulong local_f0;
  uint local_e4;
  QPDFObjGen local_e0;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  _Base_ptr *local_b0;
  long local_a8;
  _Base_ptr local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_70;
  _Base_ptr local_68;
  QPDFObjGen local_60;
  long *local_58 [2];
  long local_48 [2];
  QPDFObjGen local_38;
  
  local_f8 = (long)(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  local_d8 = shared_idx_to_obj;
  local_70 = pages;
  if ((local_f8 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_f8);
  }
  _Var31._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  lVar29 = *(qpdf_offset_t *)((long)&(_Var31._M_head_impl)->page_offset_hints + 8);
  if (*(qpdf_offset_t *)((long)&(_Var31._M_head_impl)->linp + 0x30) <= lVar29) {
    lVar29 = lVar29 + *(qpdf_offset_t *)((long)&(_Var31._M_head_impl)->linp + 0x38);
  }
  this_00 = (local_70->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((local_70->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish == this_00) {
    uVar19 = 0;
    uVar25 = 0;
LAB_0021857e:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar19,
               uVar25);
  }
  local_38 = QPDFObjectHandle::getObjGen(this_00);
  _Var31._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  cVar11 = std::
           _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::find(&((_Var31._M_head_impl)->xref_table)._M_t,&local_38);
  if (cVar11._M_node == (_Base_ptr)((long)&(_Var31._M_head_impl)->xref_table + 8U)) {
    local_160._0_8_ = local_160 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_160,"supposed first page object is not known","");
    stopOnError(this,(string *)local_160);
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
    }
  }
  qVar12 = getLinearizationOffset(this,local_38);
  if (lVar29 != qVar12) {
    msg._M_str = "first page object offset mismatch";
    msg._M_len = 0x21;
    linearizationWarning(this,msg);
  }
  if (0 < (int)(uint)local_f8) {
    local_68 = &(local_d8->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_f8 = (ulong)((uint)local_f8 & 0x7fffffff);
    uVar19 = 0;
    local_168 = this;
    do {
      this_01 = local_168;
      pQVar5 = (local_70->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar25 = (long)(local_70->
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pQVar5 >> 4;
      if (uVar25 <= uVar19) goto LAB_0021857e;
      local_e0 = QPDFObjectHandle::getObjGen(pQVar5 + uVar19);
      _Var31._M_head_impl =
           (this_01->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_60 = local_e0;
      cVar11 = std::
               _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
               ::find(&((_Var31._M_head_impl)->xref_table)._M_t,&local_60);
      if (cVar11._M_node == (_Base_ptr)((long)&(_Var31._M_head_impl)->xref_table + 8U)) {
        local_160._0_8_ = local_160 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,"unknown object in page offset hint table","");
        stopOnError(this_01,(string *)local_160);
        if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
          operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
        }
      }
      local_f0 = getLinearizationOffset(this_01,local_60);
      _Var31._M_head_impl =
           (this_01->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      lVar29 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *
                          )((long)&(_Var31._M_head_impl)->page_offset_hints + 0x40))->
                         super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
      ;
      uVar25 = ((long)*(pointer *)((long)&(_Var31._M_head_impl)->page_offset_hints + 0x48) - lVar29
               >> 3) * 0x2e8ba2e8ba2e8ba3;
      if (uVar25 < uVar19 || uVar25 - uVar19 == 0) goto LAB_0021857e;
      lVar6 = *(long *)&((_Var31._M_head_impl)->c_page_offset_data).entries;
      uVar25 = (long)*(pointer *)((long)&(_Var31._M_head_impl)->c_page_offset_data + 8) - lVar6 >> 5
      ;
      if (uVar25 <= uVar19) goto LAB_0021857e;
      piVar38 = (int *)(lVar29 + uVar19 * 0x58);
      puVar1 = (uint *)(lVar6 + uVar19 * 0x20);
      uVar37 = ((_Var31._M_head_impl)->page_offset_hints).min_nobjects + *piVar38;
      local_130 = uVar19;
      if (uVar37 != *(uint *)(lVar6 + uVar19 * 0x20)) {
        uVar27 = 1;
        if (9 < uVar19) {
          uVar28 = 4;
          uVar25 = uVar19;
          do {
            uVar27 = uVar28;
            uVar9 = (uint)uVar25;
            if (uVar9 < 100) {
              uVar27 = uVar27 - 2;
              goto LAB_00216c69;
            }
            if (uVar9 < 1000) {
              uVar27 = uVar27 - 1;
              goto LAB_00216c69;
            }
            if (uVar9 < 10000) goto LAB_00216c69;
            uVar25 = (uVar25 & 0xffffffff) / 10000;
            uVar28 = uVar27 + 4;
          } while (99999 < uVar9);
          uVar27 = uVar27 + 1;
        }
LAB_00216c69:
        local_188 = &local_178;
        local_e4 = uVar37;
        std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar27);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_188,uVar27,(uint)uVar19);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x27e8fa);
        pp_Var17 = (_Base_ptr *)(plVar13 + 2);
        if ((_Base_ptr *)*plVar13 == pp_Var17) {
          local_1d8 = *pp_Var17;
          lStack_1d0 = plVar13[3];
          local_1e8 = &local_1d8;
        }
        else {
          local_1d8 = *pp_Var17;
          local_1e8 = (_Base_ptr *)*plVar13;
        }
        local_1e0 = plVar13[1];
        *plVar13 = (long)pp_Var17;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
        puVar18 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar18) {
          local_1f8 = *puVar18;
          uStack_1f0 = puVar14[3];
          local_208 = &local_1f8;
        }
        else {
          local_1f8 = *puVar18;
          local_208 = (ulong *)*puVar14;
        }
        local_200 = puVar14[1];
        *puVar14 = puVar18;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        uVar37 = -local_e4;
        if (0 < (int)local_e4) {
          uVar37 = local_e4;
        }
        uVar27 = 1;
        if (9 < uVar37) {
          uVar19 = (ulong)uVar37;
          uVar28 = 4;
          do {
            uVar27 = uVar28;
            uVar9 = (uint)uVar19;
            if (uVar9 < 100) {
              uVar27 = uVar27 - 2;
              goto LAB_00216dbd;
            }
            if (uVar9 < 1000) {
              uVar27 = uVar27 - 1;
              goto LAB_00216dbd;
            }
            if (uVar9 < 10000) goto LAB_00216dbd;
            uVar19 = uVar19 / 10000;
            uVar28 = uVar27 + 4;
          } while (99999 < uVar9);
          uVar27 = uVar27 + 1;
        }
LAB_00216dbd:
        uVar28 = local_e4 >> 0x1f;
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_1a8,(char)uVar27 - (char)((int)local_e4 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)uVar28 + (long)local_1a8),uVar27,uVar37);
        uVar19 = 0xf;
        if (local_208 != &local_1f8) {
          uVar19 = local_1f8;
        }
        if (uVar19 < (ulong)(local_1a0 + local_200)) {
          uVar19 = 0xf;
          if (local_1a8 != &local_198) {
            uVar19 = local_198;
          }
          if (uVar19 < (ulong)(local_1a0 + local_200)) goto LAB_00216e6b;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_208);
        }
        else {
LAB_00216e6b:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1a8);
        }
        puVar18 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_228.field_2._M_allocated_capacity = *puVar18;
          local_228.field_2._8_8_ = puVar14[3];
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        }
        else {
          local_228.field_2._M_allocated_capacity = *puVar18;
          local_228._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_228._M_string_length = puVar14[1];
        *puVar14 = puVar18;
        puVar14[1] = 0;
        *(undefined1 *)puVar18 = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
        puVar20 = puVar14 + 2;
        if ((_Base_ptr *)*puVar14 == (_Base_ptr *)puVar20) {
          local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar20;
          local_128._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar14[3];
          local_128._M_impl._0_8_ = &local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
        else {
          local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar20;
          local_128._M_impl._0_8_ = (_Base_ptr *)*puVar14;
        }
        local_128._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar14[1];
        *puVar14 = puVar20;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        uVar37 = *puVar1;
        uVar27 = -uVar37;
        if (0 < (int)uVar37) {
          uVar27 = uVar37;
        }
        uVar28 = 1;
        if (9 < uVar27) {
          uVar19 = (ulong)uVar27;
          uVar9 = 4;
          do {
            uVar28 = uVar9;
            uVar10 = (uint)uVar19;
            if (uVar10 < 100) {
              uVar28 = uVar28 - 2;
              goto LAB_00216f7b;
            }
            if (uVar10 < 1000) {
              uVar28 = uVar28 - 1;
              goto LAB_00216f7b;
            }
            if (uVar10 < 10000) goto LAB_00216f7b;
            uVar19 = uVar19 / 10000;
            uVar9 = uVar28 + 4;
          } while (99999 < uVar10);
          uVar28 = uVar28 + 1;
        }
LAB_00216f7b:
        local_1c8 = &local_1b8;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_1c8,(char)uVar28 - (char)((int)uVar37 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar37 >> 0x1f) + (long)local_1c8),uVar28,uVar27);
        this_01 = local_168;
        p_Var22 = (_Base_ptr)0xf;
        if ((_Base_ptr *)local_128._M_impl._0_8_ !=
            &local_128._M_impl.super__Rb_tree_header._M_header._M_parent) {
          p_Var22 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
        if (p_Var22 < (_Base_ptr)
                      (local_1c0 + local_128._M_impl.super__Rb_tree_header._M_header._0_8_)) {
          p_Var22 = (_Base_ptr)0xf;
          if (local_1c8 != &local_1b8) {
            p_Var22 = local_1b8;
          }
          if (p_Var22 < (_Base_ptr)
                        (local_1c0 + local_128._M_impl.super__Rb_tree_header._M_header._0_8_))
          goto LAB_00217016;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_1c8,0,(char *)0x0,local_128._M_impl._0_8_);
        }
        else {
LAB_00217016:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_1c8);
        }
        local_160._0_8_ = local_160 + 0x10;
        plVar13 = puVar14 + 2;
        if ((long *)*puVar14 == plVar13) {
          local_160._16_8_ = *plVar13;
          local_160._24_8_ = puVar14[3];
        }
        else {
          local_160._16_8_ = *plVar13;
          local_160._0_8_ = (long *)*puVar14;
        }
        local_160._8_8_ = puVar14[1];
        *puVar14 = plVar13;
        puVar14[1] = 0;
        *(char *)plVar13 = '\0';
        msg_00._M_str = (char *)local_160._0_8_;
        msg_00._M_len = local_160._8_8_;
        linearizationWarning(this_01,msg_00);
        if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
          operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
        }
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8,(ulong)((long)&local_1b8->_M_color + 1));
        }
        if ((_Base_ptr *)local_128._M_impl._0_8_ !=
            &local_128._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_128._M_impl._0_8_,
                          (ulong)((long)&(local_128._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        uVar19 = local_130;
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,(ulong)((long)&local_1d8->_M_color + 1));
        }
        uVar37 = local_e4;
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
          uVar37 = local_e4;
        }
      }
      uVar37 = lengthNextN(this_01,local_e0.obj,uVar37);
      QVar30.gen = 0;
      QVar30.obj = uVar37;
      lVar29 = (long)*(int *)((long)&((this_01->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                     page_offset_hints + 0x14) + *(long *)(piVar38 + 2);
      uVar27 = (uint)lVar29;
      if ((int)uVar27 != lVar29) {
        QIntC::IntConverter<long_long,_int,_true,_true>::error(lVar29);
      }
      if (uVar37 != uVar27) {
        uVar37 = 1;
        uVar28 = (uint)uVar19;
        if (9 < uVar19) {
          uVar9 = 4;
          do {
            uVar37 = uVar9;
            uVar10 = (uint)uVar19;
            if (uVar10 < 100) {
              uVar37 = uVar37 - 2;
              goto LAB_00217238;
            }
            if (uVar10 < 1000) {
              uVar37 = uVar37 - 1;
              goto LAB_00217238;
            }
            if (uVar10 < 10000) goto LAB_00217238;
            uVar19 = (uVar19 & 0xffffffff) / 10000;
            uVar9 = uVar37 + 4;
          } while (99999 < uVar10);
          uVar37 = uVar37 + 1;
        }
LAB_00217238:
        local_58[0] = local_48;
        local_e0 = QVar30;
        std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar37);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58[0],uVar37,uVar28);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x27e91a);
        local_1c8 = &local_1b8;
        pp_Var17 = (_Base_ptr *)(plVar13 + 2);
        if ((_Base_ptr *)*plVar13 == pp_Var17) {
          local_1b8 = *pp_Var17;
          lStack_1b0 = plVar13[3];
        }
        else {
          local_1b8 = *pp_Var17;
          local_1c8 = (_Base_ptr *)*plVar13;
        }
        local_1c0 = plVar13[1];
        *plVar13 = (long)pp_Var17;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        local_1a8 = &local_198;
        puVar18 = (ulong *)(plVar13 + 2);
        if ((ulong *)*plVar13 == puVar18) {
          local_198 = *puVar18;
          lStack_190 = plVar13[3];
        }
        else {
          local_198 = *puVar18;
          local_1a8 = (ulong *)*plVar13;
        }
        local_1a0 = plVar13[1];
        *plVar13 = (long)puVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        uVar37 = -uVar27;
        if (0 < (int)uVar27) {
          uVar37 = uVar27;
        }
        uVar28 = 1;
        if (9 < uVar37) {
          uVar19 = (ulong)uVar37;
          uVar9 = 4;
          do {
            uVar28 = uVar9;
            uVar10 = (uint)uVar19;
            if (uVar10 < 100) {
              uVar28 = uVar28 - 2;
              goto LAB_00217393;
            }
            if (uVar10 < 1000) {
              uVar28 = uVar28 - 1;
              goto LAB_00217393;
            }
            if (uVar10 < 10000) goto LAB_00217393;
            uVar19 = uVar19 / 10000;
            uVar9 = uVar28 + 4;
          } while (99999 < uVar10);
          uVar28 = uVar28 + 1;
        }
LAB_00217393:
        local_90 = local_80;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_90,(char)uVar28 - ((char)((ulong)lVar29 >> 0x18) >> 7));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar27 >> 0x1f) + (long)local_90),uVar28,uVar37);
        uVar19 = 0xf;
        if (local_1a8 != &local_198) {
          uVar19 = local_198;
        }
        if (uVar19 < (ulong)(local_88 + local_1a0)) {
          uVar19 = 0xf;
          if (local_90 != local_80) {
            uVar19 = local_80[0];
          }
          if (uVar19 < (ulong)(local_88 + local_1a0)) goto LAB_00217441;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_1a8);
        }
        else {
LAB_00217441:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_90);
        }
        local_188 = &local_178;
        plVar13 = puVar14 + 2;
        if ((long *)*puVar14 == plVar13) {
          local_178 = *plVar13;
          uStack_170 = puVar14[3];
        }
        else {
          local_178 = *plVar13;
          local_188 = (long *)*puVar14;
        }
        local_180 = puVar14[1];
        *puVar14 = plVar13;
        puVar14[1] = 0;
        *(undefined1 *)plVar13 = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
        pp_Var17 = (_Base_ptr *)(plVar13 + 2);
        if ((_Base_ptr *)*plVar13 == pp_Var17) {
          local_1d8 = *pp_Var17;
          lStack_1d0 = plVar13[3];
          local_1e8 = &local_1d8;
        }
        else {
          local_1d8 = *pp_Var17;
          local_1e8 = (_Base_ptr *)*plVar13;
        }
        local_1e0 = plVar13[1];
        *plVar13 = (long)pp_Var17;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        uVar27 = local_e0.obj;
        uVar37 = -uVar27;
        if (0 < (int)uVar27) {
          uVar37 = uVar27;
        }
        uVar28 = 1;
        if (9 < uVar37) {
          uVar19 = (ulong)uVar37;
          uVar9 = 4;
          do {
            uVar28 = uVar9;
            uVar10 = (uint)uVar19;
            if (uVar10 < 100) {
              uVar28 = uVar28 - 2;
              goto LAB_00217565;
            }
            if (uVar10 < 1000) {
              uVar28 = uVar28 - 1;
              goto LAB_00217565;
            }
            if (uVar10 < 10000) goto LAB_00217565;
            uVar19 = uVar19 / 10000;
            uVar9 = uVar28 + 4;
          } while (99999 < uVar10);
          uVar28 = uVar28 + 1;
        }
LAB_00217565:
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_b0,(char)uVar28 - (local_e0.obj._3_1_ >> 7));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar27 >> 0x1f) + (long)local_b0),uVar28,uVar37);
        p_Var22 = (_Base_ptr)0xf;
        if (local_1e8 != &local_1d8) {
          p_Var22 = local_1d8;
        }
        if (p_Var22 < (_Base_ptr)(local_a8 + local_1e0)) {
          p_Var22 = (_Base_ptr)0xf;
          if (local_b0 != local_a0) {
            p_Var22 = local_a0[0];
          }
          if (p_Var22 < (_Base_ptr)(local_a8 + local_1e0)) goto LAB_002175fd;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_1e8);
        }
        else {
LAB_002175fd:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_b0);
        }
        puVar18 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar18) {
          local_1f8 = *puVar18;
          uStack_1f0 = puVar14[3];
          local_208 = &local_1f8;
        }
        else {
          local_1f8 = *puVar18;
          local_208 = (ulong *)*puVar14;
        }
        local_200 = puVar14[1];
        *puVar14 = puVar18;
        puVar14[1] = 0;
        *(undefined1 *)puVar18 = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        puVar18 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_228.field_2._M_allocated_capacity = *puVar18;
          local_228.field_2._8_8_ = puVar14[3];
        }
        else {
          local_228.field_2._M_allocated_capacity = *puVar18;
          local_228._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_228._M_string_length = puVar14[1];
        *puVar14 = puVar18;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        uVar19 = -local_f0;
        if (0 < (long)local_f0) {
          uVar19 = local_f0;
        }
        uVar37 = 1;
        if (9 < uVar19) {
          uVar25 = uVar19;
          uVar27 = 4;
          do {
            uVar37 = uVar27;
            if (uVar25 < 100) {
              uVar37 = uVar37 - 2;
              goto LAB_00217726;
            }
            if (uVar25 < 1000) {
              uVar37 = uVar37 - 1;
              goto LAB_00217726;
            }
            if (uVar25 < 10000) goto LAB_00217726;
            bVar7 = 99999 < uVar25;
            uVar25 = uVar25 / 10000;
            uVar27 = uVar37 + 4;
          } while (bVar7);
          uVar37 = uVar37 + 1;
        }
LAB_00217726:
        lVar29 = (long)local_f0 >> 0x3f;
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_d0,(char)uVar37 - (char)((long)local_f0 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long_long>
                  ((char *)((long)local_d0 - lVar29),uVar37,uVar19);
        uVar33 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          uVar33 = local_228.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar33 < local_c8 + local_228._M_string_length) {
          uVar19 = 0xf;
          if (local_d0 != local_c0) {
            uVar19 = local_c0[0];
          }
          if (uVar19 < local_c8 + local_228._M_string_length) goto LAB_002177be;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_d0,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
        }
        else {
LAB_002177be:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_d0);
        }
        local_128._M_impl._0_8_ = &local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar13 = puVar14 + 2;
        if ((_Base_ptr *)*puVar14 == (_Base_ptr *)plVar13) {
          local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
          local_128._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar14[3];
        }
        else {
          local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
          local_128._M_impl._0_8_ = (_Base_ptr *)*puVar14;
        }
        local_128._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar14[1];
        *puVar14 = plVar13;
        puVar14[1] = 0;
        *(undefined1 *)plVar13 = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        local_160._0_8_ = local_160 + 0x10;
        psVar21 = puVar14 + 2;
        if ((size_type *)*puVar14 == psVar21) {
          local_160._16_8_ = *psVar21;
          local_160._24_8_ = puVar14[3];
        }
        else {
          local_160._16_8_ = *psVar21;
          local_160._0_8_ = (size_type *)*puVar14;
        }
        local_160._8_8_ = puVar14[1];
        *puVar14 = psVar21;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        msg_01._M_str = (char *)local_160._0_8_;
        msg_01._M_len = local_160._8_8_;
        linearizationWarning(local_168,msg_01);
        if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
          operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
        }
        if ((_Base_ptr *)local_128._M_impl._0_8_ !=
            &local_128._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_128._M_impl._0_8_,
                          (ulong)((long)&(local_128._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,(ulong)((long)&local_a0[0]->_M_color + 1));
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,(ulong)((long)&local_1d8->_M_color + 1));
        }
        uVar19 = local_130;
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8,(ulong)((long)&local_1b8->_M_color + 1));
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
      }
      local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
      local_160._16_8_ = (undefined1 *)0x0;
      local_160._24_8_ = local_160 + 8;
      local_138 = 0;
      local_128._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_128._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_128._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_128._M_impl.super__Rb_tree_header._M_header;
      local_128._M_impl.super__Rb_tree_header._M_header._M_right =
           local_128._M_impl.super__Rb_tree_header._M_header._M_left;
      local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_140 = (_Rb_tree_node_base *)local_160._24_8_;
      if ((uVar19 == 0) && (0 < piVar38[4])) {
        msg_02._M_str = "page 0 has shared identifier entries";
        msg_02._M_len = 0x24;
        linearizationWarning(local_168,msg_02);
      }
      uVar19 = 0;
      paVar2 = &local_228.field_2;
      while( true ) {
        iVar32 = piVar38[4];
        if (iVar32 < 0) {
          QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar32);
          iVar32 = piVar38[4];
        }
        if ((ulong)(long)iVar32 <= uVar19) break;
        if ((ulong)(*(long *)(piVar38 + 8) - *(long *)(piVar38 + 6) >> 2) <= uVar19) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar19);
        }
        iVar32 = *(int *)(*(long *)(piVar38 + 6) + uVar19 * 4);
        local_208 = (ulong *)CONCAT44(local_208._4_4_,iVar32);
        p_Var22 = (local_d8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var26 = local_68;
        if (p_Var22 == (_Base_ptr)0x0) {
LAB_00217b59:
          local_228._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,
                     "unable to get object for item in shared objects hint table","");
          stopOnError(local_168,&local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != paVar2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          do {
            if (iVar32 <= (int)p_Var22[1]._M_color) {
              p_Var26 = p_Var22;
            }
            p_Var22 = (&p_Var22->_M_left)[(int)p_Var22[1]._M_color < iVar32];
          } while (p_Var22 != (_Base_ptr)0x0);
          if ((p_Var26 == local_68) || (iVar32 < (int)p_Var26[1]._M_color)) goto LAB_00217b59;
        }
        __v = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](local_d8,(key_type *)&local_208);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   local_160,__v);
        uVar19 = uVar19 + 1;
      }
      uVar19 = 0;
      while( true ) {
        uVar37 = puVar1[1];
        if ((int)uVar37 < 0) {
          QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(uVar37);
          uVar37 = puVar1[1];
        }
        if ((ulong)(long)(int)uVar37 <= uVar19) break;
        if ((ulong)(*(long *)(puVar1 + 4) - *(long *)(puVar1 + 2) >> 2) <= uVar19) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar19);
        }
        iVar32 = *(int *)(*(long *)(puVar1 + 2) + uVar19 * 4);
        uVar25 = (ulong)iVar32;
        _Var31._M_head_impl =
             (local_168->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        if (*(int *)((long)&(_Var31._M_head_impl)->c_shared_object_data + 8) <= iVar32) {
          local_228._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,"index out of bounds for shared object hint table","");
          stopOnError(local_168,&local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != paVar2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          _Var31._M_head_impl =
               (local_168->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        }
        if (iVar32 < 0) {
          QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar32);
        }
        lVar29 = *(long *)&((_Var31._M_head_impl)->c_shared_object_data).entries.
                           super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                           ._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&((_Var31._M_head_impl)->c_shared_object_data).entries + 8) -
                    lVar29 >> 2) <= uVar25) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar25);
        }
        local_228._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar29 + uVar25 * 4);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_128,(int *)&local_228);
        uVar19 = uVar19 + 1;
      }
      p_Var16 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var15 = (_Rb_tree_node_base *)local_160._24_8_;
      if ((_Rb_tree_node_base *)local_160._24_8_ != (_Rb_tree_node_base *)(local_160 + 8)) {
        do {
          _Var3 = p_Var15[1]._M_color;
          if (local_128._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00217d2e:
            uVar37 = 1;
            if (9 < local_130) {
              uVar19 = local_130;
              uVar27 = 4;
              do {
                uVar37 = uVar27;
                uVar28 = (uint)uVar19;
                if (uVar28 < 100) {
                  uVar37 = uVar37 - 2;
                  goto LAB_00217d85;
                }
                if (uVar28 < 1000) {
                  uVar37 = uVar37 - 1;
                  goto LAB_00217d85;
                }
                if (uVar28 < 10000) goto LAB_00217d85;
                uVar19 = (uVar19 & 0xffffffff) / 10000;
                uVar27 = uVar37 + 4;
              } while (99999 < uVar28);
              uVar37 = uVar37 + 1;
            }
LAB_00217d85:
            local_1a8 = &local_198;
            std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar37);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_1a8,uVar37,(uint)local_130);
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x268d46);
            plVar13 = puVar14 + 2;
            if ((long *)*puVar14 == plVar13) {
              local_178 = *plVar13;
              uStack_170 = puVar14[3];
              local_188 = &local_178;
            }
            else {
              local_178 = *plVar13;
              local_188 = (long *)*puVar14;
            }
            local_180 = puVar14[1];
            *puVar14 = plVar13;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_1e8 = &local_1d8;
            pp_Var17 = (_Base_ptr *)(plVar13 + 2);
            if ((_Base_ptr *)*plVar13 == pp_Var17) {
              local_1d8 = *pp_Var17;
              lStack_1d0 = plVar13[3];
            }
            else {
              local_1d8 = *pp_Var17;
              local_1e8 = (_Base_ptr *)*plVar13;
            }
            local_1e0 = plVar13[1];
            *plVar13 = (long)pp_Var17;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            _Var4 = -_Var3;
            if (0 < (int)_Var3) {
              _Var4 = _Var3;
            }
            uVar37 = 1;
            if (9 < _Var4) {
              uVar19 = (ulong)_Var4;
              uVar27 = 4;
              do {
                uVar37 = uVar27;
                uVar28 = (uint)uVar19;
                if (uVar28 < 100) {
                  uVar37 = uVar37 - 2;
                  goto LAB_00217ed4;
                }
                if (uVar28 < 1000) {
                  uVar37 = uVar37 - 1;
                  goto LAB_00217ed4;
                }
                if (uVar28 < 10000) goto LAB_00217ed4;
                uVar19 = uVar19 / 10000;
                uVar27 = uVar37 + 4;
              } while (99999 < uVar28);
              uVar37 = uVar37 + 1;
            }
LAB_00217ed4:
            local_1c8 = &local_1b8;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_1c8,(char)uVar37 - (char)((int)_Var3 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(_Var3 >> 0x1f) + (long)local_1c8),uVar37,_Var4);
            p_Var22 = (_Base_ptr)0xf;
            if (local_1e8 != &local_1d8) {
              p_Var22 = local_1d8;
            }
            if (p_Var22 < (_Base_ptr)(local_1c0 + local_1e0)) {
              p_Var22 = (_Base_ptr)0xf;
              if (local_1c8 != &local_1b8) {
                p_Var22 = local_1b8;
              }
              if (p_Var22 < (_Base_ptr)(local_1c0 + local_1e0)) goto LAB_00217f4f;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1e8);
            }
            else {
LAB_00217f4f:
              puVar14 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_1c8);
            }
            local_208 = &local_1f8;
            puVar18 = puVar14 + 2;
            if ((ulong *)*puVar14 == puVar18) {
              local_1f8 = *puVar18;
              uStack_1f0 = puVar14[3];
            }
            else {
              local_1f8 = *puVar18;
              local_208 = (ulong *)*puVar14;
            }
            local_200 = puVar14[1];
            *puVar14 = puVar18;
            puVar14[1] = 0;
            *(undefined1 *)puVar18 = 0;
            puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            puVar18 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar18) {
              local_228.field_2._M_allocated_capacity = *puVar18;
              local_228.field_2._8_8_ = puVar14[3];
            }
            else {
              local_228.field_2._M_allocated_capacity = *puVar18;
              local_228._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_228._M_string_length = puVar14[1];
            *puVar14 = puVar18;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            msg_03._M_str = local_228._M_dataplus._M_p;
            msg_03._M_len = local_228._M_string_length;
            linearizationWarning(local_168,msg_03);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,local_1f8 + 1);
            }
            if (local_1c8 != &local_1b8) {
              operator_delete(local_1c8,(ulong)((long)&local_1b8->_M_color + 1));
            }
            if (local_1e8 != &local_1d8) {
              operator_delete(local_1e8,(ulong)((long)&local_1d8->_M_color + 1));
            }
            if (local_188 != &local_178) {
              operator_delete(local_188,local_178 + 1);
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,local_198 + 1);
            }
          }
          else {
            p_Var22 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var26 = &local_128._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var34 = p_Var26;
              p_Var23 = p_Var22;
              _Var4 = p_Var23[1]._M_color;
              p_Var26 = p_Var23;
              if ((int)_Var4 < (int)_Var3) {
                p_Var26 = p_Var34;
              }
              p_Var22 = (&p_Var23->_M_left)[(int)_Var4 < (int)_Var3];
            } while ((&p_Var23->_M_left)[(int)_Var4 < (int)_Var3] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var26 == &local_128._M_impl.super__Rb_tree_header)
            goto LAB_00217d2e;
            if ((int)_Var4 < (int)_Var3) {
              p_Var23 = p_Var34;
            }
            if ((int)_Var3 < (int)p_Var23[1]._M_color) goto LAB_00217d2e;
          }
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
          p_Var16 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
        } while (p_Var15 != (_Rb_tree_node_base *)(local_160 + 8));
      }
      for (; (_Rb_tree_header *)p_Var16 != &local_128._M_impl.super__Rb_tree_header;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        _Var3 = p_Var16[1]._M_color;
        if ((undefined1 *)local_160._16_8_ == (undefined1 *)0x0) {
LAB_00218147:
          uVar37 = 1;
          if (9 < local_130) {
            uVar19 = local_130;
            uVar27 = 4;
            do {
              uVar37 = uVar27;
              uVar28 = (uint)uVar19;
              if (uVar28 < 100) {
                uVar37 = uVar37 - 2;
                goto LAB_0021819e;
              }
              if (uVar28 < 1000) {
                uVar37 = uVar37 - 1;
                goto LAB_0021819e;
              }
              if (uVar28 < 10000) goto LAB_0021819e;
              uVar19 = (uVar19 & 0xffffffff) / 10000;
              uVar27 = uVar37 + 4;
            } while (99999 < uVar28);
            uVar37 = uVar37 + 1;
          }
LAB_0021819e:
          local_1a8 = &local_198;
          std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar37);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8,uVar37,(uint)local_130);
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x268d46);
          plVar13 = puVar14 + 2;
          if ((long *)*puVar14 == plVar13) {
            local_178 = *plVar13;
            uStack_170 = puVar14[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *plVar13;
            local_188 = (long *)*puVar14;
          }
          local_180 = puVar14[1];
          *puVar14 = plVar13;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1e8 = &local_1d8;
          pp_Var17 = (_Base_ptr *)(plVar13 + 2);
          if ((_Base_ptr *)*plVar13 == pp_Var17) {
            local_1d8 = *pp_Var17;
            lStack_1d0 = plVar13[3];
          }
          else {
            local_1d8 = *pp_Var17;
            local_1e8 = (_Base_ptr *)*plVar13;
          }
          local_1e0 = plVar13[1];
          *plVar13 = (long)pp_Var17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          _Var4 = -_Var3;
          if (0 < (int)_Var3) {
            _Var4 = _Var3;
          }
          uVar37 = 1;
          if (9 < _Var4) {
            uVar19 = (ulong)_Var4;
            uVar27 = 4;
            do {
              uVar37 = uVar27;
              uVar28 = (uint)uVar19;
              if (uVar28 < 100) {
                uVar37 = uVar37 - 2;
                goto LAB_002182ed;
              }
              if (uVar28 < 1000) {
                uVar37 = uVar37 - 1;
                goto LAB_002182ed;
              }
              if (uVar28 < 10000) goto LAB_002182ed;
              uVar19 = uVar19 / 10000;
              uVar27 = uVar37 + 4;
            } while (99999 < uVar28);
            uVar37 = uVar37 + 1;
          }
LAB_002182ed:
          local_1c8 = &local_1b8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_1c8,(char)uVar37 - (char)((int)_Var3 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(_Var3 >> 0x1f) + (long)local_1c8),uVar37,_Var4);
          p_Var22 = (_Base_ptr)0xf;
          if (local_1e8 != &local_1d8) {
            p_Var22 = local_1d8;
          }
          if (p_Var22 < (_Base_ptr)(local_1c0 + local_1e0)) {
            p_Var22 = (_Base_ptr)0xf;
            if (local_1c8 != &local_1b8) {
              p_Var22 = local_1b8;
            }
            if (p_Var22 < (_Base_ptr)(local_1c0 + local_1e0)) goto LAB_00218368;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1e8);
          }
          else {
LAB_00218368:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_1c8);
          }
          local_208 = &local_1f8;
          puVar18 = puVar14 + 2;
          if ((ulong *)*puVar14 == puVar18) {
            local_1f8 = *puVar18;
            uStack_1f0 = puVar14[3];
          }
          else {
            local_1f8 = *puVar18;
            local_208 = (ulong *)*puVar14;
          }
          local_200 = puVar14[1];
          *puVar14 = puVar18;
          puVar14[1] = 0;
          *(undefined1 *)puVar18 = 0;
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          puVar18 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar18) {
            local_228.field_2._M_allocated_capacity = *puVar18;
            local_228.field_2._8_8_ = puVar14[3];
          }
          else {
            local_228.field_2._M_allocated_capacity = *puVar18;
            local_228._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_228._M_string_length = puVar14[1];
          *puVar14 = puVar18;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          msg_04._M_str = local_228._M_dataplus._M_p;
          msg_04._M_len = local_228._M_string_length;
          linearizationWarning(local_168,msg_04);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if (local_208 != &local_1f8) {
            operator_delete(local_208,local_1f8 + 1);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8,(ulong)((long)&local_1b8->_M_color + 1));
          }
          if (local_1e8 != &local_1d8) {
            operator_delete(local_1e8,(ulong)((long)&local_1d8->_M_color + 1));
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
        }
        else {
          puVar8 = (undefined1 *)local_160._16_8_;
          puVar36 = local_160 + 8;
          do {
            puVar35 = puVar36;
            puVar24 = puVar8;
            iVar32 = *(int *)(puVar24 + 0x20);
            puVar36 = puVar24;
            if (iVar32 < (int)_Var3) {
              puVar36 = puVar35;
            }
            puVar8 = *(undefined1 **)(puVar24 + ((ulong)(iVar32 < (int)_Var3) + 2) * 8);
          } while (*(undefined1 **)(puVar24 + ((ulong)(iVar32 < (int)_Var3) + 2) * 8) !=
                   (undefined1 *)0x0);
          if (puVar36 == local_160 + 8) goto LAB_00218147;
          if (iVar32 < (int)_Var3) {
            puVar24 = puVar35;
          }
          if ((int)_Var3 < *(int *)(puVar24 + 0x20)) goto LAB_00218147;
        }
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_128);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_160);
      uVar19 = local_130 + 1;
    } while (uVar19 != local_f8);
  }
  return;
}

Assistant:

void
QPDF::checkHPageOffset(
    std::vector<QPDFObjectHandle> const& pages, std::map<int, int>& shared_idx_to_obj)
{
    // Implementation note 126 says Acrobat always sets delta_content_offset and
    // delta_content_length in the page offset header dictionary to 0.  It also states that
    // min_content_offset in the per-page information is always 0, which is an incorrect value.

    // Implementation note 127 explains that Acrobat always sets item 8 (min_content_length) to
    // zero, item 9 (nbits_delta_content_length) to the value of item 5 (nbits_delta_page_length),
    // and item 7 of each per-page hint table (delta_content_length) to item 2 (delta_page_length)
    // of that entry.  Acrobat ignores these values when reading files.

    // Empirically, it also seems that Acrobat sometimes puts items under a page's /Resources
    // dictionary in with shared objects even when they are private.

    int npages = toI(pages.size());
    qpdf_offset_t table_offset = adjusted_offset(m->page_offset_hints.first_page_offset);
    QPDFObjGen first_page_og(pages.at(0).getObjGen());
    if (m->xref_table.count(first_page_og) == 0) {
        stopOnError("supposed first page object is not known");
    }
    qpdf_offset_t offset = getLinearizationOffset(first_page_og);
    if (table_offset != offset) {
        linearizationWarning("first page object offset mismatch");
    }

    for (int pageno = 0; pageno < npages; ++pageno) {
        QPDFObjGen page_og(pages.at(toS(pageno)).getObjGen());
        int first_object = page_og.getObj();
        if (m->xref_table.count(page_og) == 0) {
            stopOnError("unknown object in page offset hint table");
        }
        offset = getLinearizationOffset(page_og);

        HPageOffsetEntry& he = m->page_offset_hints.entries.at(toS(pageno));
        CHPageOffsetEntry& ce = m->c_page_offset_data.entries.at(toS(pageno));
        int h_nobjects = he.delta_nobjects + m->page_offset_hints.min_nobjects;
        if (h_nobjects != ce.nobjects) {
            // This happens with pdlin when there are thumbnails.
            linearizationWarning(
                "object count mismatch for page " + std::to_string(pageno) + ": hint table = " +
                std::to_string(h_nobjects) + "; computed = " + std::to_string(ce.nobjects));
        }

        // Use value for number of objects in hint table rather than computed value if there is a
        // discrepancy.
        int length = lengthNextN(first_object, h_nobjects);
        int h_length = toI(he.delta_page_length + m->page_offset_hints.min_page_length);
        if (length != h_length) {
            // This condition almost certainly indicates a bad hint table or a bug in this code.
            linearizationWarning(
                "page length mismatch for page " + std::to_string(pageno) + ": hint table = " +
                std::to_string(h_length) + "; computed length = " + std::to_string(length) +
                " (offset = " + std::to_string(offset) + ")");
        }

        offset += h_length;

        // Translate shared object indexes to object numbers.
        std::set<int> hint_shared;
        std::set<int> computed_shared;

        if ((pageno == 0) && (he.nshared_objects > 0)) {
            // pdlin and Acrobat both do this even though the spec states clearly and unambiguously
            // that they should not.
            linearizationWarning("page 0 has shared identifier entries");
        }

        for (size_t i = 0; i < toS(he.nshared_objects); ++i) {
            int idx = he.shared_identifiers.at(i);
            if (shared_idx_to_obj.count(idx) == 0) {
                stopOnError("unable to get object for item in shared objects hint table");
            }
            hint_shared.insert(shared_idx_to_obj[idx]);
        }

        for (size_t i = 0; i < toS(ce.nshared_objects); ++i) {
            int idx = ce.shared_identifiers.at(i);
            if (idx >= m->c_shared_object_data.nshared_total) {
                stopOnError("index out of bounds for shared object hint table");
            }
            int obj = m->c_shared_object_data.entries.at(toS(idx)).object;
            computed_shared.insert(obj);
        }

        for (int iter: hint_shared) {
            if (!computed_shared.count(iter)) {
                // pdlin puts thumbnails here even though it shouldn't
                linearizationWarning(
                    "page " + std::to_string(pageno) + ": shared object " + std::to_string(iter) +
                    ": in hint table but not computed list");
            }
        }

        for (int iter: computed_shared) {
            if (!hint_shared.count(iter)) {
                // Acrobat does not put some things including at least built-in fonts and procsets
                // here, at least in some cases.
                linearizationWarning(
                    ("page " + std::to_string(pageno) + ": shared object " + std::to_string(iter) +
                     ": in computed list but not hint table"));
            }
        }
    }
}